

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O1

wstring * __thiscall
lzstring::LZString::DeCompress_abi_cxx11_
          (wstring *__return_storage_ptr__,LZString *this,int length,int resetValue,
          GetNextCharFunc *func)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  uint uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar10;
  uint uVar11;
  size_t i;
  long lVar12;
  ulong uVar13;
  double dVar14;
  __string_type __str;
  wstring w;
  wstring entry;
  wstring result;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  dict;
  int local_100;
  int local_fc;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  int local_cc;
  value_type local_c8;
  undefined4 *local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  wstring *local_88;
  _Any_data *local_80;
  undefined4 *local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_58;
  int local_3c;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = 0;
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = L'\0';
  local_f0._M_dataplus._M_p = local_f0._M_dataplus._M_p & 0xffffffff00000000;
  local_88 = __return_storage_ptr__;
  local_3c = length;
  if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001080ad;
  local_80 = (_Any_data *)func;
  wVar2 = (*func->_M_invoker)((_Any_data *)func,(int *)&local_f0);
  lVar12 = 0;
  do {
    __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>(&local_f0,vswprintf,0x20,L"%lu",lVar12);
    std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
    emplace_back<std::__cxx11::wstring>
              ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&local_58,
               &local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity * 4 + 4);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  uVar6 = 0;
  local_100 = 1;
  uVar11 = 1;
  uVar9 = resetValue;
  do {
    if (uVar9 < 2) {
      local_f0._M_dataplus._M_p._0_4_ = local_100;
      if (*(long *)(local_80 + 1) == 0) goto LAB_001080a3;
      wVar3 = (**(code **)(local_80->_M_pod_data + 0x18))(local_80,(int *)&local_f0);
      local_100 = local_100 + 1;
      uVar7 = resetValue;
    }
    else {
      uVar7 = (int)uVar9 >> 1;
      wVar3 = wVar2;
    }
    uVar4 = 0;
    if (0 < (uVar9 & wVar2)) {
      uVar4 = uVar11;
    }
    uVar6 = uVar6 | uVar4;
    uVar11 = uVar11 * 2;
    uVar9 = uVar7;
    wVar2 = wVar3;
  } while (uVar11 != 4);
  if (uVar6 == 0) {
    iVar8 = 1;
    do {
      if (uVar7 < 2) {
        local_f0._M_dataplus._M_p._0_4_ = local_100;
        if (*(long *)(local_80 + 1) == 0) goto LAB_001080a3;
        wVar3 = (**(code **)(local_80->_M_pod_data + 0x18))(local_80,(int *)&local_f0);
        local_100 = local_100 + 1;
        uVar7 = resetValue;
      }
      else {
        uVar7 = (int)uVar7 >> 1;
      }
      iVar8 = iVar8 * 2;
    } while (iVar8 != 0x100);
  }
  else {
    if (uVar6 == 2) {
      (local_88->_M_dataplus)._M_p = (pointer)&local_88->field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_88,L"");
      goto LAB_00108010;
    }
    if (uVar6 == 1) {
      iVar8 = 1;
      do {
        if (uVar7 < 2) {
          local_f0._M_dataplus._M_p._0_4_ = local_100;
          if (*(long *)(local_80 + 1) == 0) goto LAB_001080a3;
          wVar3 = (**(code **)(local_80->_M_pod_data + 0x18))(local_80,(int *)&local_f0);
          local_100 = local_100 + 1;
          uVar7 = resetValue;
        }
        else {
          uVar7 = (int)uVar7 >> 1;
        }
        iVar8 = iVar8 * 2;
      } while (iVar8 != 0x10000);
    }
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::wstring::_M_construct((ulong)&local_f0,L'\x01');
  std::__cxx11::wstring::operator=((wstring *)&local_c8,(wstring *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity * 4 + 4);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::push_back(&local_58,&local_c8);
  std::__cxx11::wstring::push_back((wchar_t)&local_78);
  local_38 = &local_88->field_2;
  iVar8 = 3;
  local_fc = 4;
  do {
    if (local_3c < local_100) {
      (local_88->_M_dataplus)._M_p = (pointer)local_38;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_88,L"");
      break;
    }
    local_cc = iVar8;
    dVar14 = ldexp(1.0,iVar8);
    uVar11 = 0;
    if ((int)dVar14 != 1) {
      uVar11 = 0;
      uVar9 = 1;
      uVar6 = uVar7;
      wVar2 = wVar3;
      do {
        if (uVar6 < 2) {
          local_f0._M_dataplus._M_p._0_4_ = local_100;
          if (*(long *)(local_80 + 1) == 0) goto LAB_001080a3;
          wVar3 = (**(code **)(local_80->_M_pod_data + 0x18))(local_80,(int *)&local_f0);
          local_100 = local_100 + 1;
          uVar7 = resetValue;
        }
        else {
          uVar7 = (int)uVar6 >> 1;
          wVar3 = wVar2;
        }
        uVar4 = 0;
        if (0 < (uVar6 & wVar2)) {
          uVar4 = uVar9;
        }
        uVar11 = uVar11 | uVar4;
        uVar9 = uVar9 * 2;
        uVar6 = uVar7;
        wVar2 = wVar3;
      } while (uVar9 != (int)dVar14);
    }
    if (uVar11 == 0) {
      iVar8 = 1;
      do {
        if (uVar7 < 2) {
          local_f0._M_dataplus._M_p._0_4_ = local_100;
          if (*(long *)(local_80 + 1) == 0) goto LAB_001080a8;
          wVar3 = (**(code **)(local_80->_M_pod_data + 0x18))(local_80,(int *)&local_f0);
          local_100 = local_100 + 1;
          uVar7 = resetValue;
        }
        else {
          uVar7 = (int)uVar7 >> 1;
        }
        iVar8 = iVar8 * 2;
      } while (iVar8 != 0x100);
      uVar13 = (long)local_58.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::wstring::_M_construct((ulong)&local_f0,L'\x01');
      std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
      emplace_back<std::__cxx11::wstring>
                ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&local_58,
                 &local_f0);
      iVar8 = local_cc;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity * 4 + 4);
      }
      local_fc = local_fc + -1;
      uVar11 = (uint)(uVar13 >> 5);
LAB_00107e2c:
      paVar10 = &local_f0.field_2;
      if (local_fc == 0) {
        dVar14 = ldexp(1.0,iVar8);
        local_fc = (int)dVar14;
        iVar8 = iVar8 + 1;
      }
      uVar13 = (long)local_58.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar13 - 1 < (ulong)(long)(int)uVar11) {
        if (uVar13 != (long)(int)uVar11) {
          (local_88->_M_dataplus)._M_p = (pointer)local_38;
          local_88->_M_string_length = 0;
          (local_88->field_2)._M_local_buf[0] = L'\0';
          bVar1 = false;
          goto LAB_00107fd9;
        }
        local_f0._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::wstring::_M_construct<wchar_t*>
                  ((wstring *)&local_f0,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
        std::__cxx11::wstring::_M_replace_aux((ulong)&local_f0,local_f0._M_string_length,0,L'\x01');
        std::__cxx11::wstring::operator=((wstring *)&local_a8,(wstring *)&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_f0._M_dataplus._M_p != paVar10) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity * 4 + 4);
        }
      }
      else {
        std::__cxx11::wstring::_M_assign((wstring *)&local_a8);
      }
      std::__cxx11::wstring::_M_append((wchar_t *)&local_78,(ulong)local_a8);
      local_f0._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_f0,local_c8._M_dataplus._M_p,
                 local_c8._M_dataplus._M_p + local_c8._M_string_length);
      std::__cxx11::wstring::_M_replace_aux((ulong)&local_f0,local_f0._M_string_length,0,L'\x01');
      std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
      emplace_back<std::__cxx11::wstring>
                ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&local_58,
                 &local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_f0._M_dataplus._M_p != paVar10) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity * 4 + 4);
      }
      std::__cxx11::wstring::_M_assign((wstring *)&local_c8);
      bVar1 = true;
      local_fc = local_fc + -1;
      if (local_fc == 0) {
        dVar14 = ldexp(1.0,iVar8);
        local_fc = (int)dVar14;
        iVar8 = iVar8 + 1;
      }
    }
    else {
      if (uVar11 != 2) {
        iVar8 = local_cc;
        if (uVar11 == 1) {
          iVar8 = 1;
          do {
            if (uVar7 < 2) {
              local_f0._M_dataplus._M_p._0_4_ = local_100;
              if (*(long *)(local_80 + 1) == 0) goto LAB_001080a8;
              wVar3 = (**(code **)(local_80->_M_pod_data + 0x18))(local_80,(int *)&local_f0);
              local_100 = local_100 + 1;
              uVar7 = resetValue;
            }
            else {
              uVar7 = (int)uVar7 >> 1;
            }
            iVar8 = iVar8 * 2;
          } while (iVar8 != 0x10000);
          uVar13 = (long)local_58.
                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58.
                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::wstring::_M_construct((ulong)&local_f0,L'\x01');
          std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
          emplace_back<std::__cxx11::wstring>
                    ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
                     &local_58,&local_f0);
          iVar8 = local_cc;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity * 4 + 4
                           );
          }
          uVar11 = (uint)(uVar13 >> 5);
          local_fc = local_fc + -1;
        }
        goto LAB_00107e2c;
      }
      std::__cxx11::wstring::wstring((wstring *)local_88,(wstring *)&local_78);
      bVar1 = false;
      iVar8 = local_cc;
    }
LAB_00107fd9:
  } while (bVar1);
LAB_00108010:
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT44(local_c8.field_2._M_local_buf[1],local_c8.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT44(uStack_64,local_68) * 4 + 4);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT44(uStack_94,local_98) * 4 + 4);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_58);
  return local_88;
LAB_001080a3:
  std::__throw_bad_function_call();
LAB_001080a8:
  std::__throw_bad_function_call();
LAB_001080ad:
  uVar5 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT44(local_c8.field_2._M_local_buf[1],local_c8.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT44(uStack_64,local_68) * 4 + 4);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT44(uStack_94,local_98) * 4 + 4);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_58);
  _Unwind_Resume(uVar5);
}

Assistant:

std::wstring LZString::DeCompress(const int length, const int resetValue, GetNextCharFunc func)
{
	std::vector<std::wstring> dict;
	int enLargeIn = 4;
	int numBits = 3;
	std::wstring entry;
	std::wstring result;
	std::wstring w;
	int bits = 0, resb, maxpower, power;
	wchar_t c = '\0';

	wchar_t dataVal = func(0);
	int dataPosition = resetValue;
	int dataIndex = 1;

	for (size_t i = 0; i < 3; i++)
	{
		dict.push_back(std::to_wstring(i));
	}

	maxpower = (int)pow(2, 2);
	power = 1;
	while (power != maxpower)
	{
		resb = dataVal & dataPosition;
		dataPosition >>= 1;
		if (dataPosition == 0)
		{
			dataPosition = resetValue;
			dataVal = func(dataIndex++);
		}
		bits |= (resb > 0 ? 1 : 0) * power;
		power <<= 1;
	}

	switch (bits)
	{
	case 0:
		bits = 0;
		maxpower = (int)pow(2, 8);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}
		c = (wchar_t)bits;
		break;
	case 1:
		bits = 0;
		maxpower = (int)pow(2, 16);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}
		c = (wchar_t)bits;
		break;
	case 2:
		return L"";
	}
	w = std::wstring(1, c);
	dict.push_back(w);
	result.push_back(c);
	while (true)
	{
		if (dataIndex > length)
		{
			return L"";
		}

		bits = 0;
		maxpower = (int)pow(2, numBits);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}

		int c2;
		switch (c2 = bits)
		{
		case (wchar_t)0:
			bits = 0;
			maxpower = (int)pow(2, 8);
			power = 1;
			while (power != maxpower)
			{
				resb = dataVal & dataPosition;
				dataPosition >>= 1;
				if (dataPosition == 0)
				{
					dataPosition = resetValue;
					dataVal = func(dataIndex++);
				}
				bits |= (resb > 0 ? 1 : 0) * power;
				power <<= 1;
			}

			c2 = dict.size();
			dict.push_back(std::wstring(1, (wchar_t)bits));
			enLargeIn--;
			break;
		case (wchar_t)1:
			bits = 0;
			maxpower = (int)pow(2, 16);
			power = 1;
			while (power != maxpower)
			{
				resb = dataVal & dataPosition;
				dataPosition >>= 1;
				if (dataPosition == 0)
				{
					dataPosition = resetValue;
					dataVal = func(dataIndex++);
				}
				bits |= (resb > 0 ? 1 : 0) * power;
				power <<= 1;
			}

			c2 = dict.size();
			dict.push_back(std::wstring(1, (wchar_t)bits));
			enLargeIn--;
			break;
		case (wchar_t)2:
			return result;
		}

		if (enLargeIn == 0)
		{
			enLargeIn = (int)pow(2, numBits);
			numBits++;
		}

		if (dict.size() - 1 >= c2)
		{
			entry = dict[c2];
		}
		else
		{
			if (c2 == dict.size())
			{
				entry = w + w[0];
			}
			else
			{
				return std::wstring();
			}
		}

		result += entry;

		// Add w+entry[0] to the dictionary
		dict.push_back(w + entry[0]);
		enLargeIn--;

		w = entry;

		if (enLargeIn == 0)
		{
			enLargeIn = (int)pow(2, numBits);
			numBits++;
		}
	}
}